

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::LanguageScanRule
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *lang,string *config)

{
  string *name;
  char local_49;
  string local_48;
  string *local_28;
  string *config_local;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  
  local_28 = config;
  config_local = lang;
  lang_local = (string *)this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  name = cmGeneratorTarget::GetName_abi_cxx11_
                   ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_48,name);
  local_49 = '_';
  cmStrCat<std::__cxx11::string_const&,char_const(&)[8],std::__cxx11::string,char,std::__cxx11::string_const&>
            (__return_storage_ptr__,lang,(char (*) [8])0x114f0dd,&local_48,&local_49,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::LanguageScanRule(
  std::string const& lang, const std::string& config) const
{
  return cmStrCat(
    lang, "_SCAN__",
    cmGlobalNinjaGenerator::EncodeRuleName(this->GeneratorTarget->GetName()),
    '_', config);
}